

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _width,char _fill)

{
  long lVar1;
  char cVar2;
  ostringstream out;
  undefined1 auStack_1a8 [8];
  long local_1a0 [2];
  long lStack_190;
  uint auStack_188 [22];
  ios_base local_130 [112];
  char acStack_c0 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) =
       *(uint *)((long)auStack_188 + *(long *)(local_1a0[0] + -0x18)) & 0xfffffefb | 4;
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  if (acStack_c0[lVar1 + 1] == '\0') {
    cVar2 = std::ios::widen((char)auStack_1a8 + (char)lVar1 + '\b');
    acStack_c0[lVar1] = cVar2;
    acStack_c0[lVar1 + 1] = '\x01';
  }
  acStack_c0[lVar1] = _fill;
  *(long *)((long)&lStack_190 + *(long *)(local_1a0[0] + -0x18)) = (long)_width;
  std::ostream::operator<<((ostream *)local_1a0,*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << _value;
    return out.str();
}